

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O2

void __thiscall cmGlobalNinjaGenerator::AddCustomCommandRule(cmGlobalNinjaGenerator *this)

{
  cmNinjaRule rule;
  allocator<char> local_159;
  string local_158;
  cmNinjaRule local_138;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_158,"CUSTOM_COMMAND",&local_159);
  cmNinjaRule::cmNinjaRule(&local_138,&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::assign((char *)&local_138.Command);
  std::__cxx11::string::assign((char *)&local_138.Description);
  std::__cxx11::string::assign((char *)&local_138.Comment);
  AddRule(this,&local_138);
  cmNinjaRule::~cmNinjaRule(&local_138);
  return;
}

Assistant:

void cmGlobalNinjaGenerator::AddCustomCommandRule()
{
  cmNinjaRule rule("CUSTOM_COMMAND");
  rule.Command = "$COMMAND";
  rule.Description = "$DESC";
  rule.Comment = "Rule for running custom commands.";
  this->AddRule(rule);
}